

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.h
# Opt level: O0

void __thiscall
wasm::EmscriptenGlueGenerator::EmscriptenGlueGenerator
          (EmscriptenGlueGenerator *this,Module *wasm,Address stackPointerOffset)

{
  address64_t aVar1;
  Module *wasm_local;
  EmscriptenGlueGenerator *this_local;
  Address stackPointerOffset_local;
  
  this->standalone = false;
  this->sideModule = false;
  this->minimizeWasmChanges = false;
  this->noDynCalls = false;
  this->onlyI64DynCalls = false;
  this->wasm = wasm;
  this_local = (EmscriptenGlueGenerator *)stackPointerOffset.addr;
  Builder::Builder(&this->builder,wasm);
  (this->stackPointerOffset).addr = (address64_t)this_local;
  aVar1 = Address::operator_cast_to_unsigned_long((Address *)&this_local);
  this->useStackPointerGlobal = aVar1 == 0;
  return;
}

Assistant:

EmscriptenGlueGenerator(Module& wasm, Address stackPointerOffset = Address(0))
    : wasm(wasm), builder(wasm), stackPointerOffset(stackPointerOffset),
      useStackPointerGlobal(stackPointerOffset == 0) {}